

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O3

void nn_streamhdr_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint16_t uVar1;
  int iVar2;
  int extraout_EDX;
  nn_iovec iovec;
  nn_iovec local_18;
  
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) goto LAB_0013374c;
    if (type == -2) {
      nn_timer_start((nn_timer *)&self[1].shutdown_fn,1000);
      local_18.iov_base = &self[4].shutdown_fn;
      local_18.iov_len = 8;
      nn_usock_send((nn_usock *)self[3].stopped.srcptr,&local_18,1);
      *(undefined4 *)&self[1].fn = 2;
      return;
    }
    break;
  case 2:
    if (src != 2) {
      if (src == 1) {
        if (type == 8) {
          return;
        }
        if (type == 5) goto LAB_00133731;
        if (type == 3) {
          nn_usock_recv((nn_usock *)self[3].stopped.srcptr,&self[4].shutdown_fn,8,(int *)0x0);
          *(undefined4 *)&self[1].fn = 3;
          return;
        }
        goto LAB_0013378b;
      }
      goto LAB_0013376c;
    }
LAB_0013372c:
    if (type == 1) {
LAB_00133731:
      nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
      *(undefined4 *)&self[1].fn = 4;
      return;
    }
    goto LAB_0013377f;
  case 3:
    if (src == 2) {
      if (type == 1) goto LAB_00133731;
      nn_streamhdr_handler_cold_6();
      type = extraout_EDX;
      goto LAB_0013372c;
    }
    if (src != 1) goto LAB_00133762;
    if (type == 8) {
      return;
    }
    if (type == 5) goto LAB_00133731;
    if (type == 4) {
      if (*(int *)&self[4].shutdown_fn == 0x505300) {
        uVar1 = nn_gets((uint8_t *)((long)&self[4].shutdown_fn + 4));
        iVar2 = nn_pipebase_ispeer((nn_pipebase *)self[4].fn,(uint)uVar1);
        if (iVar2 != 0) {
          nn_timer_stop((nn_timer *)&self[1].shutdown_fn);
          *(undefined4 *)&self[1].fn = 5;
          return;
        }
      }
      goto LAB_00133731;
    }
    goto LAB_00133786;
  case 4:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_00133767;
    if (type == 2) {
      nn_usock_swap_owner((nn_usock *)self[3].stopped.srcptr,(nn_fsm_owner *)&self[3].stopped.type);
      self[3].stopped.srcptr = (void *)0x0;
      self[3].stopped.type = -1;
      self[3].stopped.item.next = (nn_queue_item *)0x0;
      *(undefined4 *)&self[1].fn = 6;
      iVar2 = 2;
LAB_001336d2:
      nn_fsm_raise(self,(nn_fsm_event *)&self[4].state,iVar2);
      return;
    }
    goto LAB_00133778;
  case 5:
    if (src == 1) {
      return;
    }
    if (src != 2) goto LAB_0013375d;
    if (type == 2) {
      nn_usock_swap_owner((nn_usock *)self[3].stopped.srcptr,(nn_fsm_owner *)&self[3].stopped.type);
      self[3].stopped.srcptr = (void *)0x0;
      self[3].stopped.type = -1;
      self[3].stopped.item.next = (nn_queue_item *)0x0;
      *(undefined4 *)&self[1].fn = 6;
      iVar2 = 1;
      goto LAB_001336d2;
    }
    goto LAB_00133771;
  case 6:
    nn_streamhdr_handler_cold_1();
LAB_0013374c:
    nn_streamhdr_handler_cold_12();
    break;
  default:
    goto switchD_00133548_default;
  }
  nn_streamhdr_handler_cold_13();
switchD_00133548_default:
  nn_streamhdr_handler_cold_14();
LAB_0013375d:
  nn_streamhdr_handler_cold_3();
LAB_00133762:
  nn_streamhdr_handler_cold_8();
LAB_00133767:
  nn_streamhdr_handler_cold_5();
LAB_0013376c:
  nn_streamhdr_handler_cold_11();
LAB_00133771:
  nn_streamhdr_handler_cold_2();
LAB_00133778:
  nn_streamhdr_handler_cold_4();
LAB_0013377f:
  nn_streamhdr_handler_cold_9();
LAB_00133786:
  nn_streamhdr_handler_cold_7();
LAB_0013378b:
  nn_streamhdr_handler_cold_10();
}

Assistant:

static void nn_streamhdr_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_streamhdr *streamhdr;
    struct nn_iovec iovec;
    int protocol;

    streamhdr = nn_cont (self, struct nn_streamhdr, fsm);


    switch (streamhdr->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_STREAMHDR_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_timer_start (&streamhdr->timer, 1000);
                iovec.iov_base = streamhdr->protohdr;
                iovec.iov_len = sizeof (streamhdr->protohdr);
                nn_usock_send (streamhdr->usock, &iovec, 1);
                streamhdr->state = NN_STREAMHDR_STATE_SENDING;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  SENDING state.                                                            */
/******************************************************************************/
    case NN_STREAMHDR_STATE_SENDING:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                nn_usock_recv (streamhdr->usock, streamhdr->protohdr,
                    sizeof (streamhdr->protohdr), NULL);
                streamhdr->state = NN_STREAMHDR_STATE_RECEIVING;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it. Wait for ERROR event  */
                return;
            case NN_USOCK_ERROR:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  RECEIVING state.                                                          */
/******************************************************************************/
    case NN_STREAMHDR_STATE_RECEIVING:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            switch (type) {
            case NN_USOCK_RECEIVED:

                /*  Here we are checking whether the peer speaks the same
                    protocol as this socket. */
                if (memcmp (streamhdr->protohdr, "\0SP\0", 4) != 0)
                    goto invalidhdr;
                protocol = nn_gets (streamhdr->protohdr + 4);
                if (!nn_pipebase_ispeer (streamhdr->pipebase, protocol))
                    goto invalidhdr;
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_DONE;
                return;
            case NN_USOCK_SHUTDOWN:
                /*  Ignore it. Wait for ERROR event  */
                return;
            case NN_USOCK_ERROR:
invalidhdr:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_assert (0);
            }

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&streamhdr->timer);
                streamhdr->state = NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR;
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_ERROR state.                                               */
/******************************************************************************/
    case NN_STREAMHDR_STATE_STOPPING_TIMER_ERROR:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            /*  It's safe to ignore usock event when we are stopping, but there
                is only a subset of events that are plausible. */
            return;

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_usock_swap_owner (streamhdr->usock, &streamhdr->usock_owner);
                streamhdr->usock = NULL;
                streamhdr->usock_owner.src = -1;
                streamhdr->usock_owner.fsm = NULL;
                streamhdr->state = NN_STREAMHDR_STATE_DONE;
                nn_fsm_raise (&streamhdr->fsm, &streamhdr->done,
                    NN_STREAMHDR_ERROR);
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER_DONE state.                                                */
/******************************************************************************/
    case NN_STREAMHDR_STATE_STOPPING_TIMER_DONE:
        switch (src) {

        case NN_STREAMHDR_SRC_USOCK:
            /*  It's safe to ignore usock event when we are stopping. */
            return;

        case NN_STREAMHDR_SRC_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_usock_swap_owner (streamhdr->usock, &streamhdr->usock_owner);
                streamhdr->usock = NULL;
                streamhdr->usock_owner.src = -1;
                streamhdr->usock_owner.fsm = NULL;
                streamhdr->state = NN_STREAMHDR_STATE_DONE;
                nn_fsm_raise (&streamhdr->fsm, &streamhdr->done,
                    NN_STREAMHDR_OK);
                return;
            default:
                nn_fsm_bad_action (streamhdr->state, src, type);
            }

        default:
            nn_fsm_bad_source (streamhdr->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The header exchange was either done successfully of failed. There's       */
/*  nothing that can be done in this state except stopping the object.        */
/******************************************************************************/
    case NN_STREAMHDR_STATE_DONE:
        nn_fsm_bad_source (streamhdr->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (streamhdr->state, src, type);
    }
}